

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O0

void start_output_pass(j_decompress_ptr cinfo)

{
  long lVar1;
  boolean bVar2;
  long in_RDI;
  my_coef_ptr_conflict coef;
  j_decompress_ptr in_stack_00000028;
  
  lVar1 = *(long *)(in_RDI + 0x230);
  if (*(long *)(lVar1 + 0x20) != 0) {
    if ((*(int *)(in_RDI + 0x68) == 0) || (bVar2 = smoothing_ok(in_stack_00000028), bVar2 == 0)) {
      *(code **)(lVar1 + 0x18) = decompress_data;
    }
    else {
      *(code **)(lVar1 + 0x18) = decompress_smooth_data;
    }
  }
  *(undefined4 *)(in_RDI + 0xb8) = 0;
  return;
}

Assistant:

METHODDEF(void)
start_output_pass(j_decompress_ptr cinfo)
{
#ifdef BLOCK_SMOOTHING_SUPPORTED
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;

  /* If multipass, check to see whether to use block smoothing on this pass */
  if (coef->pub.coef_arrays != NULL) {
    if (cinfo->do_block_smoothing && smoothing_ok(cinfo))
      coef->pub.decompress_data = decompress_smooth_data;
    else
      coef->pub.decompress_data = decompress_data;
  }
#endif
  cinfo->output_iMCU_row = 0;
}